

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTests::addCreateRenderbuffer(ImageTests *this,string *name,GLenum format)

{
  ImageSource *pIVar1;
  Action *pAVar2;
  UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  local_40;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_30;
  
  pAVar2 = (Action *)operator_new(0x18);
  createRenderbufferImageSource
            ((MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
              *)&local_40,format);
  pIVar1 = local_40.m_data.ptr;
  pAVar2->_vptr_Action = (_func_int **)&PTR__Create_01e10590;
  local_40.m_data.ptr = (ImageSource *)0x0;
  pAVar2[1]._vptr_Action = (_func_int **)pIVar1;
  local_30.m_data.ptr = pAVar2;
  LabeledActions::add(&this->m_createActions,name,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_30);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_30);
  de::details::
  UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  ~UniqueBase(&local_40);
  return;
}

Assistant:

void ImageTests::addCreateRenderbuffer (const string& name, GLenum format)
{
	m_createActions.add(name, MovePtr<Action>(new GLES2ImageApi::Create(createRenderbufferImageSource(format))));
}